

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  size_t sVar1;
  Instruction *op;
  Instruction *pIVar2;
  long lVar3;
  
  this->current_emitting_block = block;
  sVar1 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar1 != 0) {
    pIVar2 = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar3 = sVar1 * 0xc;
    do {
      (*(this->super_Compiler)._vptr_Compiler[8])(this,pIVar2);
      pIVar2 = pIVar2 + 1;
      lVar3 = lVar3 + -0xc;
    } while (lVar3 != 0);
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;
	for (auto &op : block.ops)
		emit_instruction(op);
	current_emitting_block = nullptr;
}